

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O1

JsErrorCode
JsTTDGetPreviousSnapshotInterval
          (JsRuntimeHandle runtimeHandle,int64_t currentSnapStartTime,int64_t *previousSnapTime)

{
  int64 iVar1;
  JsrtRuntime *runtime;
  
  ThreadContext::ValidateThreadContext(*runtimeHandle);
  if (*(EventLog **)(*runtimeHandle + 0x16b8) != (EventLog *)0x0) {
    iVar1 = TTD::EventLog::GetPreviousSnapshotInterval
                      (*(EventLog **)(*runtimeHandle + 0x16b8),currentSnapStartTime);
    *previousSnapTime = iVar1;
    return JsNoError;
  }
  TTDAbort_unrecoverable_error("Should only happen in TT debugging mode.");
}

Assistant:

CHAKRA_API JsTTDGetPreviousSnapshotInterval(_In_ JsRuntimeHandle runtimeHandle, _In_ int64_t currentSnapStartTime, _Out_ int64_t* previousSnapTime)
{
#if !ENABLE_TTD
    return JsErrorCategoryUsage;
#else
    JsrtRuntime * runtime = JsrtRuntime::FromHandle(runtimeHandle);
    ThreadContext * threadContext = runtime->GetThreadContext();
    TTDAssert(threadContext->IsRuntimeInTTDMode(), "Should only happen in TT debugging mode.");

    *previousSnapTime = threadContext->TTDLog->GetPreviousSnapshotInterval(currentSnapStartTime);

    return JsNoError;
#endif
}